

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.h
# Opt level: O0

Stack<asl::Xml> * __thiscall asl::Stack<asl::Xml>::operator>>(Stack<asl::Xml> *this,Xml *x)

{
  int iVar1;
  Xml *pXVar2;
  int lenMinusOne;
  Xml *x_local;
  Stack<asl::Xml> *this_local;
  
  iVar1 = Array<asl::Xml>::length(&this->super_Array<asl::Xml>);
  pXVar2 = Array<asl::Xml>::operator[](&this->super_Array<asl::Xml>,iVar1 + -1);
  Xml::operator=(x,pXVar2);
  Array<asl::Xml>::resize(&this->super_Array<asl::Xml>,iVar1 + -1);
  return this;
}

Assistant:

Stack& operator>>(T& x)
	{
		int lenMinusOne = this->length()-1;
		x = (*this)[lenMinusOne];
		Array<T>::resize(lenMinusOne);
		return *this;
	}